

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O3

Own<kj::WebSocket> __thiscall
kj::anon_unknown_31::HttpClientAdapter::WebSocketResponseImpl::acceptWebSocket
          (WebSocketResponseImpl *this,HttpHeaders *headers)

{
  size_t *psVar1;
  Header *pHVar2;
  long *plVar3;
  HttpHeaders *pHVar4;
  char *pcVar5;
  Header *pHVar6;
  int in_ECX;
  __fn *in_RDX;
  WebSocket *extraout_RDX;
  WebSocket *extraout_RDX_00;
  WebSocket *extraout_RDX_01;
  WebSocket *pWVar7;
  void *in_R8;
  long lVar8;
  Own<kj::WebSocket> OVar9;
  Own<kj::HttpHeaders> headersCopy;
  undefined8 *local_c8;
  ArrayDisposer *local_c0;
  Array<kj::StringPtr> *local_b8;
  HttpHeaders *local_b0;
  size_t local_a8;
  char *pcStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined8 uStack_90;
  undefined1 local_88 [40];
  RemoveConst<kj::HttpHeaders::Header> *local_60;
  Header *local_58;
  
  HttpHeaders::clone((HttpHeaders *)local_88,in_RDX,in_RDX,in_ECX,in_R8);
  heap<kj::HttpHeaders>((kj *)&local_c8,(HttpHeaders *)local_88);
  HttpHeaders::~HttpHeaders((HttpHeaders *)local_88);
  newWebSocketPipe();
  psVar1 = &(headers->indexedHeaders).size_;
  *(int *)psVar1 = (int)*psVar1 + 1;
  local_b8 = &headers->indexedHeaders;
  local_b0 = headers;
  Promise<void>::
  attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>>
            ((Promise<void> *)local_88,
             (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl> *)
             &(headers->unindexedHeaders).builder.pos);
  pHVar6 = (Header *)operator_new(0x38);
  pcVar5 = pcStack_a0;
  pHVar4 = local_b0;
  (pHVar6->name).content.ptr = (char *)&PTR_send_00446528;
  pcStack_a0 = (char *)0x0;
  (pHVar6->name).content.size_ = local_a8;
  (pHVar6->value).content.ptr = pcVar5;
  *(undefined1 *)&(pHVar6->value).content.size_ = 1;
  *(undefined4 *)&pHVar6[1].name.content.ptr = local_88._0_4_;
  *(undefined4 *)((long)&pHVar6[1].name.content.ptr + 4) = local_88._4_4_;
  *(undefined4 *)&pHVar6[1].name.content.size_ = local_88._8_4_;
  *(undefined4 *)((long)&pHVar6[1].name.content.size_ + 4) = local_88._12_4_;
  *(undefined2 *)&pHVar6[1].value.content.ptr = 0;
  if (local_b0 != (HttpHeaders *)0x0) {
    local_b0 = (HttpHeaders *)0x0;
    (*(code *)(local_b8->ptr->content).ptr)
              (local_b8,(long)&pHVar4->table + (long)pHVar4->table[-1].idsByName.disposer);
  }
  pHVar2 = (headers->unindexedHeaders).builder.ptr;
  local_88._0_4_ = 0x65;
  local_88._8_8_ = "Switching Protocols";
  local_88._16_8_ = 0x14;
  local_88._24_8_ = local_c0;
  local_60 = (RemoveConst<kj::HttpHeaders::Header> *)operator_new(0x28);
  (local_60->name).content.size_ = (size_t)local_c8;
  (local_60->value).content.ptr = (char *)local_c0;
  local_c0 = (ArrayDisposer *)0x0;
  (local_60->value).content.size_ =
       (size_t)&_::HeapDisposer<kj::(anonymous_namespace)::HttpClientAdapter::DelayedCloseWebSocket>
                ::instance;
  local_60[1].name.content.ptr = (char *)pHVar6;
  (local_60->name).content.ptr = (char *)&PTR_disposeImpl_00447fa8;
  local_88._32_4_ = 2;
  local_58 = pHVar6;
  (**(code **)(pHVar2->name).content.ptr)(pHVar2,local_88);
  OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_>::destroy
            ((OneOf<kj::Own<kj::AsyncInputStream>,_kj::Own<kj::WebSocket>_> *)(local_88 + 0x20));
  *(undefined4 *)&(this->super_Response)._vptr_Response = local_98;
  *(undefined4 *)((long)&(this->super_Response)._vptr_Response + 4) = uStack_94;
  *(undefined4 *)&(this->super_Refcounted).super_Disposer._vptr_Disposer = (undefined4)uStack_90;
  *(undefined4 *)((long)&(this->super_Refcounted).super_Disposer._vptr_Disposer + 4) =
       uStack_90._4_4_;
  uStack_90 = 0;
  lVar8 = 0x10;
  pWVar7 = extraout_RDX;
  do {
    plVar3 = *(long **)((long)&pcStack_a0 + lVar8);
    if (plVar3 != (long *)0x0) {
      *(undefined8 *)((long)&pcStack_a0 + lVar8) = 0;
      (**(code **)**(undefined8 **)((long)&local_a8 + lVar8))
                (*(undefined8 **)((long)&local_a8 + lVar8),(long)plVar3 + *(long *)(*plVar3 + -0x10)
                );
      pWVar7 = extraout_RDX_00;
    }
    lVar8 = lVar8 + -0x10;
  } while (lVar8 != -0x10);
  if (local_c0 != (ArrayDisposer *)0x0) {
    local_c0 = (ArrayDisposer *)0x0;
    (**(code **)*local_c8)();
    pWVar7 = extraout_RDX_01;
  }
  OVar9.ptr = pWVar7;
  OVar9.disposer = (Disposer *)this;
  return OVar9;
}

Assistant:

kj::Own<WebSocket> acceptWebSocket(const HttpHeaders& headers) override {
      // The caller of HttpClient is allowed to assume that the headers remain valid until the body
      // stream is dropped, but the HttpService implementation is allowed to send headers that are
      // only valid until acceptWebSocket() returns, so we have to copy.
      auto headersCopy = kj::heap(headers.clone());

      auto pipe = newWebSocketPipe();

      // Wrap the client-side WebSocket in a wrapper that delays clean close of the WebSocket until
      // the service's request promise has finished.
      kj::Own<WebSocket> wrapper =
          kj::heap<DelayedCloseWebSocket>(kj::mv(pipe.ends[0]), task.attach(kj::addRef(*this)));
      fulfiller->fulfill({
        101, "Switching Protocols", headersCopy.get(),
        wrapper.attach(kj::mv(headersCopy))
      });
      return kj::mv(pipe.ends[1]);
    }